

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

void __thiscall AST::ASTBuilder::insertRightChild(ASTBuilder *this)

{
  stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_> *this_00;
  ASTNode *node;
  ASTNode *this_01;
  _Elt_pointer ppAVar1;
  value_type A;
  ASTNode *local_28;
  
  this_00 = &this->stack;
  ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar1 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  node = ppAVar1[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar1 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_01 = ppAVar1[-1];
  local_28 = this_01;
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  ASTNode::addChildToRight(this_01,node);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back(&this_00->c,&local_28);
  return;
}

Assistant:

void AST::ASTBuilder::insertRightChild() {
    auto B = stack.top();
    stack.pop();
    auto A = stack.top();
    stack.pop();
    A->addChildToRight(B);
    stack.push(A);
}